

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O1

void amrex::anon_unknown_1::MLNodeLinOp_set_dot_mask
               (MultiFab *dot_mask,iMultiFab *omask,Geometry *geom,
               GpuArray<amrex::LinOpBCType,_3U> *lobc,GpuArray<amrex::LinOpBCType,_3U> *hibc,
               CoarseningStrategy strategy)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int i;
  long lVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  double *pdVar14;
  long lVar15;
  double *pdVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Box bx;
  MFIter mfi;
  Array4<double> local_1a8;
  ulong local_168;
  long local_160;
  undefined8 local_158;
  int local_150;
  int local_14c [5];
  uint local_138;
  int local_134;
  uint local_130;
  int local_12c;
  FabArray<amrex::FArrayBox> *local_128;
  GpuArray<amrex::LinOpBCType,_3U> *local_120;
  FabArray<amrex::IArrayBox> *local_118;
  GpuArray<amrex::LinOpBCType,_3U> *local_110;
  long local_108;
  long local_100;
  long local_f8;
  Box local_ec;
  Array4<const_int> local_d0;
  MFIter local_90;
  
  local_158 = *(undefined8 *)(geom->domain).smallend.vect;
  uVar1 = *(undefined8 *)((geom->domain).smallend.vect + 2);
  uVar2 = *(undefined8 *)((geom->domain).bigend.vect + 2);
  local_14c[1] = (int)((ulong)*(undefined8 *)(geom->domain).bigend.vect >> 0x20);
  local_14c[2] = (int)uVar2;
  local_14c[3] = (int)((ulong)uVar2 >> 0x20);
  local_150 = (int)uVar1;
  local_14c[0] = (int)((ulong)uVar1 >> 0x20);
  lVar7 = 0;
  do {
    if (((uint)local_14c[3] >> ((uint)lVar7 & 0x1f) & 1) == 0) {
      local_14c[lVar7] = local_14c[lVar7] + 1;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_14c[3] = 7;
  if (strategy != Sigma) {
    local_158._4_4_ = (uint)((ulong)local_158 >> 0x20);
    local_150 = local_150 + -1000;
    local_14c[0] = local_14c[0] + 1000;
    local_158 = CONCAT44(local_158._4_4_ + -1000,(int)local_158 + -1000);
    local_14c[1] = local_14c[1] + 1000;
    local_14c[2] = local_14c[2] + 1000;
  }
  local_128 = &dot_mask->super_FabArray<amrex::FArrayBox>;
  local_118 = &omask->super_FabArray<amrex::IArrayBox>;
  local_110 = lobc;
  MFIter::MFIter(&local_90,(FabArrayBase *)dot_mask,true);
  iVar6 = local_14c[2];
  iVar5 = local_150;
  if (local_90.currentIndex < local_90.endIndex) {
    local_12c = (int)local_158;
    local_130 = local_158._4_4_;
    local_134 = local_14c[0];
    local_138 = local_14c[1];
    local_120 = hibc;
    do {
      MFIter::tilebox(&local_ec,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_1a8,local_128,&local_90);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_d0,local_118,&local_90);
      auVar4 = _DAT_0077bb40;
      auVar3 = _DAT_0077bb30;
      lVar7 = (long)local_ec.smallend.vect[0];
      local_160 = (long)local_ec.smallend.vect[1];
      local_168 = (ulong)(uint)local_ec.bigend.vect[1];
      if (local_ec.smallend.vect[2] <= local_ec.bigend.vect[2]) {
        uVar8 = local_ec.bigend.vect[0] - local_ec.smallend.vect[0];
        auVar23._4_4_ = 0;
        auVar23._0_4_ = uVar8;
        auVar23._8_4_ = uVar8;
        auVar23._12_4_ = 0;
        local_100 = lVar7 * 4;
        local_108 = lVar7 * 8;
        iVar12 = local_ec.smallend.vect[2];
        do {
          if (local_ec.smallend.vect[1] <= local_ec.bigend.vect[1]) {
            local_f8 = (long)local_1a8.begin.z;
            lVar11 = (long)local_d0.p +
                     (local_160 - local_d0.begin.y) * local_d0.jstride * 4 +
                     ((long)iVar12 - (long)local_d0.begin.z) * local_d0.kstride * 4 +
                     (long)local_d0.begin.x * -4 + local_100 + 4;
            lVar15 = (long)local_1a8.p +
                     (local_160 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                     (iVar12 - local_f8) * local_1a8.kstride * 8 + (long)local_1a8.begin.x * -8 +
                     local_108 + 8;
            lVar9 = local_160;
            do {
              if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
                uVar13 = 0;
                do {
                  auVar21._8_4_ = (int)uVar13;
                  auVar21._0_8_ = uVar13;
                  auVar21._12_4_ = (int)(uVar13 >> 0x20);
                  auVar27 = auVar23 ^ auVar4;
                  auVar21 = (auVar21 | auVar3) ^ auVar4;
                  if ((bool)(~(auVar21._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar21._0_4_ ||
                              auVar27._4_4_ < auVar21._4_4_) & 1)) {
                    *(double *)(lVar15 + -8 + uVar13 * 8) =
                         (double)*(int *)(lVar11 + -4 + uVar13 * 4);
                  }
                  if (auVar21._12_4_ <= auVar27._12_4_ &&
                      (auVar21._12_4_ != auVar27._12_4_ || auVar21._8_4_ <= auVar27._8_4_)) {
                    *(double *)(lVar15 + uVar13 * 8) = (double)*(int *)(lVar11 + uVar13 * 4);
                  }
                  uVar13 = uVar13 + 2;
                } while (((ulong)uVar8 + 2 & 0x1fffffffe) != uVar13);
              }
              lVar9 = lVar9 + 1;
              lVar11 = lVar11 + local_d0.jstride * 4;
              lVar15 = lVar15 + local_1a8.jstride * 8;
            } while (local_ec.bigend.vect[1] + 1U != (int)lVar9);
          }
          bVar17 = iVar12 != local_ec.bigend.vect[2];
          iVar12 = iVar12 + 1;
        } while (bVar17);
      }
      lVar9 = (long)local_ec.smallend.vect[2];
      if (((local_110->arr[0] == Neumann) || (local_110->arr[0] == inflow)) &&
         (local_ec.smallend.vect[2] <= local_ec.bigend.vect[2] &&
          local_ec.smallend.vect[0] == local_12c)) {
        pdVar14 = (double *)
                  ((lVar9 - local_1a8.begin.z) * local_1a8.kstride * 8 +
                   (local_160 - local_1a8.begin.y) * local_1a8.jstride * 8 + lVar7 * 8 +
                   (long)local_1a8.begin.x * -8 + (long)local_1a8.p);
        lVar11 = lVar9;
        do {
          pdVar16 = pdVar14;
          iVar12 = (local_ec.bigend.vect[1] - local_ec.smallend.vect[1]) + 1;
          if (local_ec.smallend.vect[1] <= local_ec.bigend.vect[1]) {
            do {
              *pdVar16 = *pdVar16 * 0.5;
              pdVar16 = pdVar16 + local_1a8.jstride;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          lVar11 = lVar11 + 1;
          pdVar14 = pdVar14 + local_1a8.kstride;
        } while (local_ec.bigend.vect[2] + 1 != (int)lVar11);
      }
      if (((local_120->arr[0] == inflow) || (local_120->arr[0] == Neumann)) &&
         (local_ec.smallend.vect[2] <= local_ec.bigend.vect[2] &&
          local_ec.bigend.vect[0] == local_134)) {
        pdVar14 = (double *)
                  ((lVar9 - local_1a8.begin.z) * local_1a8.kstride * 8 +
                   (local_160 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                   (long)local_ec.bigend.vect[0] * 8 + (long)local_1a8.begin.x * -8 +
                  (long)local_1a8.p);
        lVar11 = lVar9;
        do {
          pdVar16 = pdVar14;
          iVar12 = (local_ec.bigend.vect[1] - local_ec.smallend.vect[1]) + 1;
          if (local_ec.smallend.vect[1] <= local_ec.bigend.vect[1]) {
            do {
              *pdVar16 = *pdVar16 * 0.5;
              pdVar16 = pdVar16 + local_1a8.jstride;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          lVar11 = lVar11 + 1;
          pdVar14 = pdVar14 + local_1a8.kstride;
        } while (local_ec.bigend.vect[2] + 1 != (int)lVar11);
      }
      if (((local_110->arr[1] == inflow) || (local_110->arr[1] == Neumann)) &&
         (local_ec.smallend.vect[2] <= local_ec.bigend.vect[2] &&
          local_ec.smallend.vect[1] == local_130)) {
        uVar8 = local_ec.bigend.vect[0] - local_ec.smallend.vect[0];
        auVar27._4_4_ = 0;
        auVar27._0_4_ = uVar8;
        auVar27._8_4_ = uVar8;
        auVar27._12_4_ = 0;
        lVar15 = (long)local_1a8.p +
                 (lVar9 - local_1a8.begin.z) * local_1a8.kstride * 8 +
                 (local_ec.smallend.vect[1] - local_1a8.begin.y) * local_1a8.jstride * 8 + lVar7 * 8
                 + (long)local_1a8.begin.x * -8 + 8;
        auVar27 = auVar27 ^ auVar4;
        lVar11 = lVar9;
        do {
          if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
            uVar13 = 0;
            do {
              auVar22._8_4_ = (int)uVar13;
              auVar22._0_8_ = uVar13;
              auVar22._12_4_ = (int)(uVar13 >> 0x20);
              auVar23 = (auVar22 | auVar3) ^ auVar4;
              if ((bool)(~(auVar27._4_4_ < auVar23._4_4_ ||
                          auVar27._0_4_ < auVar23._0_4_ && auVar23._4_4_ == auVar27._4_4_) & 1)) {
                *(double *)(lVar15 + -8 + uVar13 * 8) = *(double *)(lVar15 + -8 + uVar13 * 8) * 0.5;
              }
              if (auVar23._12_4_ <= auVar27._12_4_ &&
                  (auVar23._8_4_ <= auVar27._8_4_ || auVar23._12_4_ != auVar27._12_4_)) {
                *(double *)(lVar15 + uVar13 * 8) = *(double *)(lVar15 + uVar13 * 8) * 0.5;
              }
              uVar13 = uVar13 + 2;
            } while (((ulong)uVar8 + 2 & 0x1fffffffe) != uVar13);
          }
          lVar11 = lVar11 + 1;
          lVar15 = lVar15 + local_1a8.kstride * 8;
        } while (local_ec.bigend.vect[2] + 1 != (int)lVar11);
      }
      if (((local_120->arr[1] == inflow) || (local_120->arr[1] == Neumann)) &&
         (local_ec.smallend.vect[2] <= local_ec.bigend.vect[2] &&
          local_ec.bigend.vect[1] == local_138)) {
        uVar8 = local_ec.bigend.vect[0] - local_ec.smallend.vect[0];
        auVar18._4_4_ = 0;
        auVar18._0_4_ = uVar8;
        auVar18._8_4_ = uVar8;
        auVar18._12_4_ = 0;
        lVar11 = (long)local_1a8.p +
                 (lVar9 - local_1a8.begin.z) * local_1a8.kstride * 8 +
                 (local_ec.bigend.vect[1] - local_1a8.begin.y) * local_1a8.jstride * 8 + lVar7 * 8 +
                 (long)local_1a8.begin.x * -8 + 8;
        auVar18 = auVar18 ^ auVar4;
        do {
          if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
            uVar13 = 0;
            do {
              auVar24._8_4_ = (int)uVar13;
              auVar24._0_8_ = uVar13;
              auVar24._12_4_ = (int)(uVar13 >> 0x20);
              auVar23 = (auVar24 | auVar3) ^ auVar4;
              if ((bool)(~(auVar18._4_4_ < auVar23._4_4_ ||
                          auVar18._0_4_ < auVar23._0_4_ && auVar23._4_4_ == auVar18._4_4_) & 1)) {
                *(double *)(lVar11 + -8 + uVar13 * 8) = *(double *)(lVar11 + -8 + uVar13 * 8) * 0.5;
              }
              if (auVar23._12_4_ <= auVar18._12_4_ &&
                  (auVar23._8_4_ <= auVar18._8_4_ || auVar23._12_4_ != auVar18._12_4_)) {
                *(double *)(lVar11 + uVar13 * 8) = *(double *)(lVar11 + uVar13 * 8) * 0.5;
              }
              uVar13 = uVar13 + 2;
            } while (((ulong)uVar8 + 2 & 0x1fffffffe) != uVar13);
          }
          lVar9 = lVar9 + 1;
          lVar11 = lVar11 + local_1a8.kstride * 8;
        } while (local_ec.bigend.vect[2] + 1 != (int)lVar9);
      }
      if (local_110->arr[2] == Neumann) {
        bVar17 = local_ec.smallend.vect[2] == iVar5;
      }
      else {
        bVar17 = local_ec.smallend.vect[2] == iVar5 && local_110->arr[2] == inflow;
      }
      if (local_ec.smallend.vect[1] <= local_ec.bigend.vect[1] && bVar17) {
        uVar8 = local_ec.bigend.vect[1];
        if (local_ec.bigend.vect[1] < local_ec.smallend.vect[1]) {
          uVar8 = local_ec.smallend.vect[1];
        }
        uVar10 = local_ec.bigend.vect[0] - local_ec.smallend.vect[0];
        auVar19._4_4_ = 0;
        auVar19._0_4_ = uVar10;
        auVar19._8_4_ = uVar10;
        auVar19._12_4_ = 0;
        lVar11 = (long)local_1a8.p +
                 (local_160 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                 (local_ec.smallend.vect[2] - local_1a8.begin.z) * local_1a8.kstride * 8 + lVar7 * 8
                 + (long)local_1a8.begin.x * -8 + 8;
        lVar9 = local_160;
        do {
          if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
            uVar13 = 0;
            do {
              auVar25._8_4_ = (int)uVar13;
              auVar25._0_8_ = uVar13;
              auVar25._12_4_ = (int)(uVar13 >> 0x20);
              auVar21 = auVar19 ^ auVar4;
              auVar23 = (auVar25 | auVar3) ^ auVar4;
              if ((bool)(~(auVar23._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar23._0_4_ ||
                          auVar21._4_4_ < auVar23._4_4_) & 1)) {
                *(double *)(lVar11 + -8 + uVar13 * 8) = *(double *)(lVar11 + -8 + uVar13 * 8) * 0.5;
              }
              if (auVar23._12_4_ <= auVar21._12_4_ &&
                  (auVar23._12_4_ != auVar21._12_4_ || auVar23._8_4_ <= auVar21._8_4_)) {
                *(double *)(lVar11 + uVar13 * 8) = *(double *)(lVar11 + uVar13 * 8) * 0.5;
              }
              uVar13 = uVar13 + 2;
            } while (((ulong)uVar10 + 2 & 0x1fffffffe) != uVar13);
          }
          lVar9 = lVar9 + 1;
          lVar11 = lVar11 + local_1a8.jstride * 8;
        } while (uVar8 + 1 != (int)lVar9);
      }
      if (local_120->arr[2] == Neumann) {
        bVar17 = local_ec.bigend.vect[2] == iVar6;
      }
      else {
        bVar17 = local_ec.bigend.vect[2] == iVar6 && local_120->arr[2] == inflow;
      }
      if (local_ec.smallend.vect[1] <= local_ec.bigend.vect[1] && bVar17) {
        uVar8 = local_ec.bigend.vect[1];
        if (local_ec.bigend.vect[1] < local_ec.smallend.vect[1]) {
          uVar8 = local_ec.smallend.vect[1];
        }
        uVar10 = local_ec.bigend.vect[0] - local_ec.smallend.vect[0];
        auVar20._4_4_ = 0;
        auVar20._0_4_ = uVar10;
        auVar20._8_4_ = uVar10;
        auVar20._12_4_ = 0;
        lVar9 = (long)local_1a8.p +
                (local_160 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                (local_ec.bigend.vect[2] - local_1a8.begin.z) * local_1a8.kstride * 8 + lVar7 * 8 +
                (long)local_1a8.begin.x * -8 + 8;
        lVar7 = local_160;
        do {
          if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
            uVar13 = 0;
            do {
              auVar26._8_4_ = (int)uVar13;
              auVar26._0_8_ = uVar13;
              auVar26._12_4_ = (int)(uVar13 >> 0x20);
              auVar21 = auVar20 ^ auVar4;
              auVar23 = (auVar26 | auVar3) ^ auVar4;
              if ((bool)(~(auVar23._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar23._0_4_ ||
                          auVar21._4_4_ < auVar23._4_4_) & 1)) {
                *(double *)(lVar9 + -8 + uVar13 * 8) = *(double *)(lVar9 + -8 + uVar13 * 8) * 0.5;
              }
              if (auVar23._12_4_ <= auVar21._12_4_ &&
                  (auVar23._12_4_ != auVar21._12_4_ || auVar23._8_4_ <= auVar21._8_4_)) {
                *(double *)(lVar9 + uVar13 * 8) = *(double *)(lVar9 + uVar13 * 8) * 0.5;
              }
              uVar13 = uVar13 + 2;
            } while (((ulong)uVar10 + 2 & 0x1fffffffe) != uVar13);
          }
          lVar7 = lVar7 + 1;
          lVar9 = lVar9 + local_1a8.jstride * 8;
        } while (uVar8 + 1 != (int)lVar7);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void MLNodeLinOp_set_dot_mask (MultiFab& dot_mask, iMultiFab const& omask, Geometry const& geom,
                               GpuArray<LinOpBCType,AMREX_SPACEDIM> const& lobc,
                               GpuArray<LinOpBCType,AMREX_SPACEDIM> const& hibc,
                               MLNodeLinOp::CoarseningStrategy strategy)
{
    Box nddomain = amrex::surroundingNodes(geom.Domain());

    if (strategy != MLNodeLinOp::CoarseningStrategy::Sigma) {
        nddomain.grow(1000); // hack to avoid masks being modified at Neuman boundary
    }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(dot_mask,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& dfab = dot_mask.array(mfi);
        Array4<int const> const& sfab = omask.const_array(mfi);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
        {
            mlndlap_set_dot_mask(tbx, dfab, sfab, nddomain, lobc, hibc);
        });
    }
}